

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

void google::protobuf::internal::FailDynamicCast(MessageLite *from,MessageLite *to)

{
  ClassData *pCVar1;
  LogMessage *pLVar2;
  LogMessage local_90;
  Voidify local_79;
  undefined1 auStack_78 [8];
  string_view from_name;
  LogMessage local_40;
  Voidify local_29;
  undefined1 auStack_28 [8];
  string_view to_name;
  MessageLite *to_local;
  MessageLite *from_local;
  
  to_name._M_str = (char *)to;
  _auStack_28 = MessageLite::GetTypeName(to);
  pCVar1 = GetClassData(from);
  if ((pCVar1->is_dynamic & 1U) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0xd5);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [57])
                               "Cannot downcast from a DynamicMessage to generated type ");
    from_name._M_str = (char *)auStack_28;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,_auStack_28);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  _auStack_78 = MessageLite::GetTypeName(from);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
             ,0xda);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [17])"Cannot downcast ");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,_auStack_78);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,(char (*) [5])0x853ada);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,_auStack_28);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_90);
}

Assistant:

void FailDynamicCast(const MessageLite& from, const MessageLite& to) {
  const auto to_name = to.GetTypeName();
  if (internal::GetClassData(from)->is_dynamic) {
    ABSL_LOG(FATAL)
        << "Cannot downcast from a DynamicMessage to generated type "
        << to_name;
  }
  const auto from_name = from.GetTypeName();
  ABSL_LOG(FATAL) << "Cannot downcast " << from_name << " to " << to_name;
}